

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.h
# Opt level: O0

int kputs(char *p,kstring_t *s)

{
  int iVar1;
  size_t sVar2;
  kstring_t *s_local;
  char *p_local;
  
  sVar2 = strlen(p);
  iVar1 = kputsn(p,(int)sVar2,s);
  return iVar1;
}

Assistant:

static inline int kputs(const char *p, kstring_t *s)
{
	return kputsn(p, strlen(p), s);
}